

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbcore.c
# Opt level: O2

void s3_am_init(kbcore_t *kbc)

{
  cmd_ln_t *cmdln;
  feat_t *feat;
  double dVar1;
  double dVar2;
  int32 iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  int32 **subvecs;
  mdef_t *pmVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *lambdafile;
  ms_mgau_model_t *pmVar11;
  mgau_model_t *pmVar12;
  s2_semi_mgau_t *psVar13;
  long lVar14;
  tmat_t *ptVar15;
  
  cmdln = kbc->config;
  kbc->mgau = (mgau_model_t *)0x0;
  kbc->ms_mgau = (ms_mgau_model_t *)0x0;
  pcVar5 = cmd_ln_str_r(cmdln,"-hmm");
  if (pcVar5 != (char *)0x0) {
    s3_add_file(cmdln,"-mdef",pcVar5,"mdef");
    s3_add_file(cmdln,"-mean",pcVar5,"means");
    s3_add_file(cmdln,"-var",pcVar5,"variances");
    s3_add_file(cmdln,"-tmat",pcVar5,"transition_matrices");
    s3_add_file(cmdln,"-mixw",pcVar5,"mixture_weights");
    s3_add_file(cmdln,"-kdtree",pcVar5,"kdtrees");
    s3_add_file(cmdln,"-lda",pcVar5,"feature_transform");
    s3_add_file(cmdln,"-fdict",pcVar5,"noisedict");
    s3_add_file(cmdln,"-featparams",pcVar5,"feat.params");
  }
  pcVar5 = cmd_ln_str_r(cmdln,"-lda");
  if (pcVar5 == (char *)0x0) {
LAB_0010f816:
    pcVar5 = cmd_ln_str_r(cmdln,"-svspec");
    if (pcVar5 == (char *)0x0) {
LAB_0010f88c:
      err_msg(ERR_INFO,(char *)0x0,0,"Reading HMM in Sphinx 3 Model format\n");
      pcVar5 = cmd_ln_str_r(cmdln,"-mdef");
      err_msg(ERR_INFO,(char *)0x0,0,"Model Definition File: %s\n",pcVar5);
      pcVar5 = cmd_ln_str_r(cmdln,"-mean");
      err_msg(ERR_INFO,(char *)0x0,0,"Mean File: %s\n",pcVar5);
      pcVar5 = cmd_ln_str_r(cmdln,"-var");
      err_msg(ERR_INFO,(char *)0x0,0,"Variance File: %s\n",pcVar5);
      pcVar5 = cmd_ln_str_r(cmdln,"-mixw");
      err_msg(ERR_INFO,(char *)0x0,0,"Mixture Weight File: %s\n",pcVar5);
      pcVar5 = cmd_ln_str_r(cmdln,"-tmat");
      err_msg(ERR_INFO,(char *)0x0,0,"Transition Matrices File: %s\n",pcVar5);
      pcVar5 = cmd_ln_str_r(cmdln,"-mdef");
      pmVar7 = mdef_init(pcVar5,1);
      kbc->mdef = pmVar7;
      if (pmVar7 == (mdef_t *)0x0) {
        pcVar5 = cmd_ln_str_r(cmdln,"-mdef");
        pcVar8 = "mdef_init(%s) failed\n";
        lVar6 = 0x124;
LAB_0010fe95:
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,lVar6,pcVar8,pcVar5);
        goto LAB_0010febb;
      }
      mdef_report(pmVar7);
      pcVar5 = cmd_ln_str_r(kbc->config,"-senmgau");
      iVar4 = strcmp(pcVar5,".cont.");
      if (iVar4 == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,0x12e,"Using optimized GMM computation for Continuous HMM, -topn will be ignored\n"
               );
        pcVar8 = cmd_ln_str_r(cmdln,"-mean");
        pcVar9 = cmd_ln_str_r(cmdln,"-var");
        dVar1 = cmd_ln_float_r(cmdln,"-varfloor");
        pcVar10 = cmd_ln_str_r(cmdln,"-mixw");
        dVar2 = cmd_ln_float_r(cmdln,"-mixwfloor");
        pmVar12 = mgau_init(pcVar8,pcVar9,(float64)(double)(float)dVar1,pcVar10,
                            (float64)(double)(float)dVar2,1,pcVar5,0x4e23,kbc->logmath);
        kbc->mgau = pmVar12;
        if (((kbc->mdef == (mdef_t *)0x0) || (pmVar12 == (mgau_model_t *)0x0)) ||
           (kbc->mdef->n_sen == pmVar12->n_mgau)) {
LAB_0010fcdb:
          pcVar5 = cmd_ln_str_r(cmdln,"-tmat");
          dVar1 = cmd_ln_float_r(cmdln,"-tmatfloor");
          ptVar15 = tmat_init(pcVar5,(float64)(double)(float)dVar1,1,kbc->logmath);
          kbc->tmat = ptVar15;
          if (ptVar15 == (tmat_t *)0x0) {
            pcVar5 = cmd_ln_str_r(cmdln,"-tmat");
            dVar1 = cmd_ln_float_r(cmdln,"-tmatfloor");
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                    ,0x179,"tmat_init (%s, %e) failed\n",SUB84((double)(float)dVar1,0),pcVar5);
            goto LAB_0010febb;
          }
          tmat_report(ptVar15);
          pmVar7 = kbc->mdef;
          if ((pmVar7 == (mdef_t *)0x0) || (ptVar15 = kbc->tmat, ptVar15 == (tmat_t *)0x0)) {
            return;
          }
          if (pmVar7->n_tmat == ptVar15->n_tmat) {
            if (pmVar7->n_emit_state == ptVar15->n_state) {
              return;
            }
            pcVar5 = "Mdef #states(%d) != tmat #states(%d)\n";
            lVar6 = 0x186;
          }
          else {
            pcVar5 = "Mdef #tmat(%d) != tmatfile(%d)\n";
            lVar6 = 0x183;
          }
        }
        else {
          pcVar5 = "Mdef #senones(%d) != mgau #senones(%d)\n";
          lVar6 = 0x13d;
        }
      }
      else {
        iVar4 = strcmp(pcVar5,".s2semi.");
        if (iVar4 == 0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x143,"Using Sphinx2 multi-stream GMM computation\n");
          psVar13 = s2_semi_mgau_init(cmdln,kbc->logmath,kbc->fcb,kbc->mdef);
          kbc->s2_mgau = psVar13;
          if (((kbc->mdef == (mdef_t *)0x0) || (psVar13 == (s2_semi_mgau_t *)0x0)) ||
             (kbc->mdef->n_sen == psVar13->n_sen)) {
            pcVar5 = cmd_ln_str_r(cmdln,"-kdtree");
            if (pcVar5 != (char *)0x0) {
              psVar13 = kbc->s2_mgau;
              lVar6 = cmd_ln_int_r(cmdln,"-kdmaxdepth");
              lVar14 = cmd_ln_int_r(cmdln,"-kdmaxbbi");
              iVar4 = s2_semi_mgau_load_kdtree(psVar13,pcVar5,(uint32)lVar6,(int32)lVar14);
              if (iVar4 < 0) {
                pcVar8 = "Failed to load kdtrees from %s\n";
                lVar6 = 0x154;
                goto LAB_0010fe95;
              }
            }
            goto LAB_0010fcdb;
          }
          pcVar5 = "Mdef #senones(%d) != s2_semi_mgau #PDFs(%d)\n";
          lVar6 = 0x14b;
        }
        else {
          iVar4 = strcmp(pcVar5,".semi.");
          if (((iVar4 != 0) && (iVar4 = strcmp(pcVar5,".ptm."), iVar4 != 0)) &&
             (iVar4 = strcmp(pcVar5,".s3cont."), iVar4 != 0)) {
            pcVar8 = "Feature should be either .semi., .cont., or .ptm., is %s\n";
            lVar6 = 0x170;
            goto LAB_0010fe95;
          }
          lambdafile = (char *)0x0;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x15d,"Using multi-stream GMM computation\n");
          pcVar8 = cmd_ln_str_r(cmdln,"-mean");
          pcVar9 = cmd_ln_str_r(cmdln,"-var");
          dVar1 = cmd_ln_float_r(cmdln,"-varfloor");
          pcVar10 = cmd_ln_str_r(cmdln,"-mixw");
          dVar2 = cmd_ln_float_r(cmdln,"-mixwfloor");
          iVar4 = cmd_ln_exists_r(cmdln,"-lambda");
          if (iVar4 != 0) {
            lambdafile = cmd_ln_str_r(cmdln,"-lambda");
          }
          lVar6 = cmd_ln_int_r(cmdln,"-topn");
          pmVar11 = ms_mgau_init(pcVar8,pcVar9,(float64)(double)(float)dVar1,pcVar10,
                                 (float64)(double)(float)dVar2,1,pcVar5,lambdafile,(int32)lVar6,
                                 kbc->logmath,kbc->mdef);
          kbc->ms_mgau = pmVar11;
          if (kbc->mdef->n_sen == pmVar11->s->n_sen) goto LAB_0010fcdb;
          pcVar5 = "Model definition has %d senones; but #senone= %d\n";
          lVar6 = 0x16d;
        }
      }
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,lVar6,pcVar5);
      goto LAB_0010febb;
    }
    pcVar5 = cmd_ln_str_r(cmdln,"-svspec");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x114,"Using subvector specification %s\n",pcVar5);
    pcVar5 = cmd_ln_str_r(cmdln,"-svspec");
    subvecs = parse_subvecs(pcVar5);
    if (subvecs == (int32 **)0x0) {
      pcVar5 = "Subvector specification failed to parse.\n";
      lVar6 = 0x116;
    }
    else {
      iVar4 = feat_set_subvecs(kbc->fcb,subvecs);
      if (-1 < iVar4) goto LAB_0010f88c;
      pcVar5 = "Failed to set subvector specification.\n";
      lVar6 = 0x118;
    }
  }
  else {
    err_msg(ERR_INFO,(char *)0x0,0,"Reading Feature Space Transform from: %s\n",pcVar5);
    feat = kbc->fcb;
    lVar6 = cmd_ln_int_r(cmdln,"-ldadim");
    iVar3 = feat_read_lda(feat,pcVar5,(int32)lVar6);
    if (-1 < iVar3) goto LAB_0010f816;
    pcVar5 = "LDA initialization failed.\n";
    lVar6 = 0x10e;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
          ,lVar6,pcVar5);
LAB_0010febb:
  exit(1);
}

Assistant:

void
s3_am_init(kbcore_t * kbc)
{
    char const *fn;
    cmd_ln_t *config = kbcore_config(kbc);

    kbc->mgau = NULL;
    kbc->ms_mgau = NULL;

    s3_init_defaults(config);

    if ((fn = cmd_ln_str_r(config, "-lda"))) {
        E_INFO_NOFN("Reading Feature Space Transform from: %s\n", fn);
        if (feat_read_lda(kbcore_fcb(kbc), fn,
                          cmd_ln_int32_r(config, "-ldadim")) < 0)
            E_FATAL("LDA initialization failed.\n");
    }

    if (cmd_ln_str_r(config, "-svspec")) {
        int32 **subvecs;
        E_INFO("Using subvector specification %s\n", 
               cmd_ln_str_r(config, "-svspec"));
        if ((subvecs = parse_subvecs(cmd_ln_str_r(config, "-svspec"))) == NULL)
	    E_FATAL("Subvector specification failed to parse.\n");
        if ((feat_set_subvecs(kbcore_fcb(kbc), subvecs)) < 0)
	    E_FATAL("Failed to set subvector specification.\n");
    }

    E_INFO_NOFN("Reading HMM in Sphinx 3 Model format\n");
    E_INFO_NOFN("Model Definition File: %s\n", cmd_ln_str_r(config, "-mdef"));
    E_INFO_NOFN("Mean File: %s\n", cmd_ln_str_r(config, "-mean"));
    E_INFO_NOFN("Variance File: %s\n", cmd_ln_str_r(config, "-var"));
    E_INFO_NOFN("Mixture Weight File: %s\n", cmd_ln_str_r(config, "-mixw"));
    E_INFO_NOFN("Transition Matrices File: %s\n", cmd_ln_str_r(config, "-tmat"));

    if ((kbc->mdef = mdef_init(cmd_ln_str_r(config, "-mdef"),
                               REPORT_KBCORE)) == NULL)
        E_FATAL("mdef_init(%s) failed\n", cmd_ln_str_r(config, "-mdef"));

    if (REPORT_KBCORE) {
        mdef_report(kbc->mdef);
    }

    fn = cmd_ln_str_r(kbcore_config(kbc), "-senmgau");
    if (strcmp(fn, ".cont.") == 0) {
        /* Single stream optmized GMM computation Initialization */
        E_INFO
            ("Using optimized GMM computation for Continuous HMM, -topn will be ignored\n");
        kbc->mgau = mgau_init(cmd_ln_str_r(config, "-mean"),
                              cmd_ln_str_r(config, "-var"),
                              cmd_ln_float32_r(config, "-varfloor"),
                              cmd_ln_str_r(config, "-mixw"),
                              cmd_ln_float32_r(config, "-mixwfloor"),
                              TRUE,      /* Do precomputation */
                              (char *)fn,
                              MIX_INT_FLOAT_COMP,     /*Use hybrid integer and float routine */
                              kbc->logmath);

        if (kbc->mdef && kbc->mgau) {
            /* Verify senone parameters against model definition parameters */
            if (kbc->mdef->n_sen != mgau_n_mgau(kbc->mgau))
                E_FATAL("Mdef #senones(%d) != mgau #senones(%d)\n",
                        kbc->mdef->n_sen, mgau_n_mgau(kbc->mgau));
        }

    }
    else if (strcmp(fn, ".s2semi.") == 0) {
        /* SC_VQ initialization. */
        E_INFO("Using Sphinx2 multi-stream GMM computation\n");
        kbc->s2_mgau = s2_semi_mgau_init(config, kbc->logmath,
					 kbcore_fcb(kbc),
					 kbcore_mdef(kbc));
        if (kbc->mdef && kbc->s2_mgau) {
            /* Verify senone parameters against model definition parameters */
            if (kbc->mdef->n_sen != kbc->s2_mgau->n_sen)
                E_FATAL("Mdef #senones(%d) != s2_semi_mgau #PDFs(%d)\n",
                        kbc->mdef->n_sen, kbc->s2_mgau->n_sen);
        }
        /* FIXME: This should probably move as soon as we support kd-trees
         * for other model types. */
        if ((fn = cmd_ln_str_r(config, "-kdtree"))) {
            if (s2_semi_mgau_load_kdtree(kbc->s2_mgau,
                                         fn,
                                         cmd_ln_int32_r(config, "-kdmaxdepth"),
                                         cmd_ln_int32_r(config, "-kdmaxbbi")) < 0) {
                E_FATAL("Failed to load kdtrees from %s\n", fn);
            }
        }
    }
    else if (strcmp(fn, ".semi.") == 0
	     || strcmp(fn, ".ptm.") == 0
	     || strcmp(fn, ".s3cont.") == 0) {
        senone_t *sen;
        /* Multiple stream Gaussian mixture Initialization */
        E_INFO("Using multi-stream GMM computation\n");
        kbc->ms_mgau = ms_mgau_init(cmd_ln_str_r(config, "-mean"),
                                    cmd_ln_str_r(config, "-var"),
                                    cmd_ln_float32_r(config, "-varfloor"),
                                    cmd_ln_str_r(config, "-mixw"),
                                    cmd_ln_float32_r(config, "-mixwfloor"),
                                    TRUE,        /*Do precomputation */
                                    (char *)fn,
                                    cmd_ln_exists_r(config, "-lambda")
                                    ? cmd_ln_str_r(config, "-lambda") : NULL,
                                    cmd_ln_int32_r(config, "-topn"),
                                    kbc->logmath, kbc->mdef);
        sen = ms_mgau_senone(kbc->ms_mgau);
        /* Verify senone parameters against model definition parameters */
        if (kbc->mdef->n_sen != sen->n_sen)
            E_FATAL("Model definition has %d senones; but #senone= %d\n",
                    kbc->mdef->n_sen, sen->n_sen);
    }
    else {
        E_FATAL("Feature should be either .semi., .cont., or .ptm., is %s\n", fn);
    }


    /* STRUCTURE: Initialize the transition matrices */
    if ((kbc->tmat = tmat_init(cmd_ln_str_r(config, "-tmat"),
                               cmd_ln_float32_r(config, "-tmatfloor"),
                               REPORT_KBCORE, kbc->logmath)) == NULL)
        E_FATAL("tmat_init (%s, %e) failed\n", cmd_ln_str_r(config, "-tmat"),
                cmd_ln_float32_r(config, "-tmatfloor"));

    if (REPORT_KBCORE) {
        tmat_report(kbc->tmat);
    }

    if (kbc->mdef && kbc->tmat) {
        /* Verify transition matrices parameters against model definition parameters */
        if (kbc->mdef->n_tmat != kbc->tmat->n_tmat)
            E_FATAL("Mdef #tmat(%d) != tmatfile(%d)\n", kbc->mdef->n_tmat,
                    kbc->tmat->n_tmat);
        if (kbc->mdef->n_emit_state != kbc->tmat->n_state)
            E_FATAL("Mdef #states(%d) != tmat #states(%d)\n",
                    kbc->mdef->n_emit_state, kbc->tmat->n_state);
    }
}